

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

void __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::~basic_seq_coro_file
          (basic_seq_coro_file<(coro_io::execution_type)1> *this)

{
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *in_RDI;
  
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::fstream::~fstream(in_RDI + 1);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ~ExecutorWrapper(in_RDI);
  return;
}

Assistant:

basic_seq_coro_file(coro_io::ExecutorWrapper<> *executor =
                          coro_io::get_global_block_executor())
      : basic_seq_coro_file(executor->get_asio_executor()) {}